

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,Address *out_align)

{
  uint uVar1;
  Location loc;
  TokenType TVar2;
  Result RVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  Token token;
  Token local_68;
  
  TVar2 = Peek(this,0);
  if (TVar2 == AlignEqNat) {
    Consume(&local_68,this);
    if (5 < local_68.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    RVar3 = ParseInt64(local_68.field_2.text_._M_str,
                       local_68.field_2.text_._M_str + local_68.field_2.text_._M_len,out_align,
                       UnsignedOnly);
    if (RVar3.enum_ == Error) {
      loc.filename._M_len._4_4_ = local_68.loc.filename._M_len._4_4_;
      loc.filename._M_len._0_4_ = (undefined4)local_68.loc.filename._M_len;
      loc.filename._M_str._0_4_ = local_68.loc.filename._M_str._0_4_;
      loc.filename._M_str._4_4_ = local_68.loc.filename._M_str._4_4_;
      loc.field_1.field_0.line = local_68.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_68.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_68.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_68.loc.field_1._12_4_;
      Error(this,loc,"invalid alignment \"%.*s\"",local_68.field_2.text_._M_len & 0xffffffff,
            local_68.field_2.text_._M_str,in_R8,in_R9);
    }
    uVar1 = (uint)*out_align - 1;
    if (((uint)*out_align ^ uVar1) <= uVar1) {
      Error(this,0x16a059);
    }
  }
  else {
    *out_align = 0xffffffffffffffff;
  }
  return TVar2 == AlignEqNat;
}

Assistant:

bool WastParser::ParseAlignOpt(Address* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    std::string_view sv = token.text();
    if (Failed(ParseInt64(sv, out_align, ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}